

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O2

int Abc_CommandInvCheck(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  uint uVar5;
  char *pcVar6;
  
  aVar3 = Abc_Clock();
  uVar5 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    uVar5 = uVar5 ^ 1;
  }
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      pcVar6 = "Abc_CommandInvMin(): There is no current design.\n";
    }
    else if (pAbc->pAbcWlcInv == (Vec_Int_t *)0x0) {
      pcVar6 = "Abc_CommandInvMin(): There is no saved invariant.\n";
    }
    else {
      iVar1 = pAbc->pGia->nRegs;
      iVar2 = Vec_IntEntryLast(pAbc->pAbcWlcInv);
      if (iVar1 == iVar2) {
        uVar5 = Pdr_InvCheck(pAbc->pGia,pAbc->pAbcWlcInv,uVar5);
        if (uVar5 == 0) {
          printf("Invariant verification succeeded.    ");
        }
        else {
          if (pAbc->pAbcWlcInv->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("Invariant verification failed for %d clauses (out of %d). ",(ulong)uVar5,
                 (ulong)(uint)*pAbc->pAbcWlcInv->pArray);
        }
        aVar4 = Abc_Clock();
        Abc_Print(1,"%s =","Time");
        Abc_Print(1,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
        return 0;
      }
      pcVar6 = 
      "Abc_CommandInvMin(): The number of flops in the invariant and in GIA should be the same.\n";
    }
    iVar1 = 0;
    Abc_Print(1,pcVar6);
  }
  else {
    Abc_Print(-2,"usage: inv_check [-vh]\n");
    Abc_Print(-2,"\t         checks that the invariant is indeed an inductive invariant\n");
    Abc_Print(-2,"\t         (AIG representing the design should be in the &-space)\n");
    pcVar6 = "yes";
    if (uVar5 == 0) {
      pcVar6 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandInvCheck( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    abctime clk = Abc_Clock();
    extern int Pdr_InvCheck( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose );
    int c, nFailed, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): There is no saved invariant.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) != Vec_IntEntryLast(Wlc_AbcGetInv(pAbc)) )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): The number of flops in the invariant and in GIA should be the same.\n" );
        return 0;
    }
    nFailed = Pdr_InvCheck( pAbc->pGia, Wlc_AbcGetInv(pAbc), fVerbose );
    if ( nFailed )
        printf( "Invariant verification failed for %d clauses (out of %d). ", nFailed, Vec_IntEntry(Wlc_AbcGetInv(pAbc),0) );
    else
        printf( "Invariant verification succeeded.    " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;
usage:
    Abc_Print( -2, "usage: inv_check [-vh]\n" );
    Abc_Print( -2, "\t         checks that the invariant is indeed an inductive invariant\n" );
    Abc_Print( -2, "\t         (AIG representing the design should be in the &-space)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}